

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

void __thiscall StackSolver::solve(StackSolver *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pSVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int varnum;
  long lVar8;
  int iVar9;
  value_type_conflict2 local_2c;
  
  piVar3 = (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_2c = 0xffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->soln,
             (long)(this->vnlist).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vnlist).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_2c);
  duplicate(this);
  propagate(this,0,0);
  uVar5 = ((long)(this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                super__Vector_impl_data._M_start) / 0xc;
  iVar7 = (int)uVar5;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar7 < 1) {
    uVar5 = 0;
  }
  iVar7 = iVar7 + 2;
  do {
    iVar9 = 0;
    for (lVar8 = 0; uVar5 * 0xc - lVar8 != 0; lVar8 = lVar8 + 0xc) {
      pSVar4 = (this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = *(int *)((long)&pSVar4->var1 + lVar8);
      varnum = *(int *)((long)&pSVar4->var2 + lVar8);
      iVar2 = piVar3[iVar1];
      iVar6 = piVar3[varnum];
      if (iVar2 == 0xffff) {
        if (iVar6 == 0xffff) {
          iVar9 = iVar9 + 1;
        }
        else {
          iVar6 = iVar6 + *(int *)((long)&pSVar4->rhs + lVar8);
          varnum = iVar1;
LAB_0030ab1e:
          propagate(this,varnum,iVar6);
        }
      }
      else if (iVar6 == 0xffff) {
        iVar6 = iVar2 - *(int *)((long)&pSVar4->rhs + lVar8);
        goto LAB_0030ab1e;
      }
    }
    if ((iVar9 == iVar7) || (iVar7 = iVar9, iVar9 < 1)) {
      return;
    }
  } while( true );
}

Assistant:

void StackSolver::solve(void)

{
  // Use guesses to resolve subsystems not uniquely determined
  int4 i,size,var1,var2,count,lastcount;

  soln.clear();
  soln.resize(vnlist.size(),65535); // Initialize solutions vector
  duplicate();			// Duplicate and sort the equations

  propagate(0,0);		// We know one variable
  size = guess.size();
  lastcount = size+2;
  do {
    count = 0;
    for(i=0;i<size;++i) {
      var1 = guess[i].var1;
      var2 = guess[i].var2;
      if ((soln[var1]!=65535)&&(soln[var2]==65535))
	propagate(var2,soln[var1]-guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]!=65535))
	propagate(var1,soln[var2]+guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]==65535))
	count += 1;
    }
    if (count == lastcount) break;
    lastcount = count;
  } while(count > 0);
}